

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

YieldResult * __thiscall
NEST::NESTcalc::GetYieldBetaGR
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,vector<double,_std::allocator<double>_> *ERYieldsParam,double multFact)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  runtime_error *this_00;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  Wvalue WVar9;
  double local_a0;
  
  if ((ulong)((long)(ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 0x50) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"ERROR: You need a minimum of 10 nuisance parameters for the mean yields.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  WVar9 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
  pdVar4 = (ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (*pdVar4 < 0.0) {
    dVar3 = pow(dfield / 73.855,2.0318);
    pow(dVar3 + 1.0,0.41883);
    pdVar4 = (ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  dVar3 = pdVar4[2];
  if (dVar3 < 0.0) {
    dVar3 = log10(dfield);
    dVar3 = dVar3 * 0.13946236 + 0.52561312;
    pdVar4 = (ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  local_a0 = pdVar4[3];
  if (local_a0 < 0.0) {
    dVar7 = pow(dfield / 144.65029656,-2.80532006);
    local_a0 = 1.00311313 / (dVar7 + 1.0) + 1.82217496;
    pdVar4 = (ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pdVar4[4] < 0.0) {
    erf(energy * 0.05);
    pdVar4 = (ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  dVar7 = pdVar4[6];
  if (dVar7 < 0.0) {
    dVar7 = pow(dfield / 256.48156448,1.29119251);
    dVar7 = 91.25015493 / (dVar7 + 1.0) + 7.02921301;
    pdVar4 = (ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  dVar1 = pdVar4[7];
  dVar2 = pdVar4[8];
  uVar5 = -(ulong)(dVar1 < 0.0);
  uVar6 = -(ulong)(dVar2 < 0.0);
  dVar8 = pdVar4[9];
  if (dVar8 < 0.0) {
    dVar8 = pow(dfield / 139.26046,-0.65763592);
    dVar8 = 0.0657813262 / (dVar8 + 1.0) + 0.0508273937;
  }
  dVar3 = pow(energy / dVar3,local_a0);
  pow(dVar3 + 1.0,(double)(~uVar6 & (ulong)dVar2 | uVar6 & 0x3fd566e40e862058));
  dVar3 = pow(energy / dVar7,(double)(~uVar5 & (ulong)dVar1 | uVar5 & 0x401124a3f7a7a80b));
  pow(dVar3 + 1.0,dVar8);
  pdVar4 = (ERYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start + 5;
  if (*pdVar4 <= 0.0 && *pdVar4 != 0.0) {
    dVar3 = pow(density,1.7);
    log(dVar3 * 0.16365278618915824 + 1.0);
    pow(density,-1.7);
  }
  erf(energy * 0.05);
  (*this->_vptr_NESTcalc[0xb])(SUB84(energy,0),WVar9.Wq_eV,__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

YieldResult
NESTcalc::GetYieldBetaGR(double energy, double density, double dfield,
                         const std::vector<double> &ERYieldsParam, double multFact) {
  
  if (ERYieldsParam.size() < 10) {
    throw std::runtime_error(
        "ERROR: You need a minimum of 10 nuisance parameters for the mean "
        "yields.");
  }

  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double alpha = wvalue.alpha;

  double Nq = energy * 1e3 / Wq_eV, m01, m02, m03, m04, m05, m07, m08, m09, m10;
  if (ERYieldsParam[0] < 0.)
    m01 = 30.66 +
          (6.1978 - 30.66) / pow(1. + pow(dfield / 73.855, 2.0318), 0.41883);
  else
    m01 = ERYieldsParam[0];
  if (ERYieldsParam[1] < 0.)
    m02 = 77.2931084;
  else
    m02 = ERYieldsParam[1];
  if (ERYieldsParam[2] < 0.)
    m03 = log10(dfield) * 0.13946236 + 0.52561312;
  else
    m03 = ERYieldsParam[2];
  if (ERYieldsParam[3] < 0.)
    m04 = 1.82217496 + (2.82528809 - 1.82217496) /
                           (1. + pow(dfield / 144.65029656, -2.80532006));
  else
    m04 = ERYieldsParam[3];
  if (ERYieldsParam[4] < 0.)
    m05 = Nq / energy / (1. + alpha * erf(0.05 * energy)) - m01;
  else
    m05 = ERYieldsParam[4];
  if (ERYieldsParam[6] < 0.)
    m07 = 7.02921301 + (98.27936794 - 7.02921301) /
                           (1. + pow(dfield / 256.48156448, 1.29119251));
  else
    m07 = ERYieldsParam[6];
  if (ERYieldsParam[7] < 0.)
    m08 = 4.285781736;
  else
    m08 = ERYieldsParam[7];
  if (ERYieldsParam[8] < 0.)
    m09 = 0.3344049589;
  else
    m09 = ERYieldsParam[8];
  if (ERYieldsParam[9] < 0.)
    m10 = 0.0508273937 + (0.1166087199 - 0.0508273937) /
                             (1. + pow(dfield / 1.39260460e+02, -0.65763592));
  else
    m10 = ERYieldsParam[9];
  double Qy = m01 + (m02 - m01) / pow((1. + pow(energy / m03, m04)), m09) +
              m05 + (0.0 - m05) / pow((1. + pow(energy / m07, m08)), m10);

  if (ERYieldsParam[5] <
      0.) {  // toggle the density and W corrections, which could override you
    double coeff_TI = pow(1. / DENSITY, 0.3);
    double coeff_Ni = pow(1. / DENSITY, 1.4);
    double coeff_OL = pow(1. / DENSITY, -1.7) /
                      log(1. + coeff_TI * coeff_Ni * pow(DENSITY, 1.7));
    Qy *= coeff_OL * log(1. + coeff_TI * coeff_Ni * pow(density, 1.7)) *
          pow(density, -1.7);
    if (!fdetector->get_OldW13eV()) Qy *= ZurichEXOQ;
  }
  Qy *= multFact;
  double Ly = Nq / energy - Qy;
  double Ne = Qy * energy;
  double Nph = Ly * energy;
  double lux_NexONi = alpha * erf(0.05 * energy);

  YieldResult result{};
  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  result.ExcitonRatio = lux_NexONi;
  result.Lindhard = 1.;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations;
}